

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

Am_Wrapper * get_double_click_inter_proc(Am_Object *self)

{
  Am_Wrapper *pAVar1;
  Am_Object inter;
  Am_Object AStack_28;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Get_Object(&local_10,(Am_Slot_Key)self,10);
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)&local_10,10);
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)&AStack_28,(ulong)Am_UNDO_SCROLL_GROUP);
  Am_Object::Get_Object(&local_18,(Am_Slot_Key)&local_20,0x1b8);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&AStack_28);
  Am_Object::~Am_Object(&local_10);
  pAVar1 = Am_Object::operator_cast_to_Am_Wrapper_(&local_18);
  Am_Object::~Am_Object(&local_18);
  return pAVar1;
}

Assistant:

Am_Define_Object_Formula(get_double_click_inter)
{
  //self is inter, owner is sub_menu ,owner is widget, owner is undo_db,
  // get Am_UNDO_SCROLL_GROUP of undo_db, get Am_ARROW_INTERACTOR of that
  Am_Object inter = self.Get_Owner()
                        .Get_Owner()
                        .Get_Object(Am_UNDO_SCROLL_GROUP)
                        .Get_Object(Am_ARROW_INTERACTOR);
  return inter;
}